

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

hpdata_t * duckdb_je_hpdata_age_heap_first(hpdata_age_heap_t *ph)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pvVar1 = (ph->ph).root;
  if (pvVar1 == (void *)0x0) {
    return (hpdata_t *)0x0;
  }
  (ph->ph).auxcount = 0;
  lVar5 = *(long *)((long)pvVar1 + 0x30);
  if (lVar5 != 0) {
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)(lVar5 + 0x28) = 0;
    lVar6 = *(long *)(lVar5 + 0x30);
    if (lVar6 != 0) {
      lVar7 = *(long *)(lVar6 + 0x30);
      if (lVar7 != 0) {
        *(undefined8 *)(lVar7 + 0x28) = 0;
      }
      *(undefined8 *)(lVar5 + 0x28) = 0;
      *(undefined8 *)(lVar5 + 0x30) = 0;
      *(undefined8 *)(lVar6 + 0x28) = 0;
      *(undefined8 *)(lVar6 + 0x30) = 0;
      if (*(ulong *)(lVar5 + 8) < *(ulong *)(lVar6 + 8)) {
        *(long *)(lVar6 + 0x28) = lVar5;
        lVar4 = *(long *)(lVar5 + 0x38);
        *(long *)(lVar6 + 0x30) = lVar4;
        if (lVar4 != 0) {
          *(long *)(lVar4 + 0x28) = lVar6;
        }
        *(long *)(lVar5 + 0x38) = lVar6;
        lVar6 = lVar5;
        lVar4 = lVar5;
      }
      else {
        *(long *)(lVar5 + 0x28) = lVar6;
        lVar4 = *(long *)(lVar6 + 0x38);
        *(long *)(lVar5 + 0x30) = lVar4;
        if (lVar4 != 0) {
          *(long *)(lVar4 + 0x28) = lVar5;
        }
        *(long *)(lVar6 + 0x38) = lVar5;
        lVar4 = lVar6;
      }
      while (lVar5 = lVar7, lVar5 != 0) {
        lVar2 = *(long *)(lVar5 + 0x30);
        if (lVar2 == 0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)(lVar2 + 0x30);
          if (lVar7 != 0) {
            *(undefined8 *)(lVar7 + 0x28) = 0;
          }
          *(undefined8 *)(lVar5 + 0x28) = 0;
          *(undefined8 *)(lVar5 + 0x30) = 0;
          *(undefined8 *)(lVar2 + 0x28) = 0;
          *(undefined8 *)(lVar2 + 0x30) = 0;
          if (*(ulong *)(lVar5 + 8) < *(ulong *)(lVar2 + 8)) {
            *(long *)(lVar2 + 0x28) = lVar5;
            lVar3 = *(long *)(lVar5 + 0x38);
            *(long *)(lVar2 + 0x30) = lVar3;
            if (lVar3 != 0) {
              *(long *)(lVar3 + 0x28) = lVar2;
            }
            *(long *)(lVar5 + 0x38) = lVar2;
          }
          else {
            *(long *)(lVar5 + 0x28) = lVar2;
            lVar3 = *(long *)(lVar2 + 0x38);
            *(long *)(lVar5 + 0x30) = lVar3;
            if (lVar3 != 0) {
              *(long *)(lVar3 + 0x28) = lVar5;
            }
            *(long *)(lVar2 + 0x38) = lVar5;
            lVar5 = lVar2;
          }
        }
        *(long *)(lVar6 + 0x30) = lVar5;
        lVar6 = lVar5;
      }
      lVar7 = *(long *)(lVar4 + 0x30);
      lVar5 = lVar4;
      if (lVar7 != 0) {
        while( true ) {
          lVar2 = *(long *)(lVar7 + 0x30);
          *(undefined8 *)(lVar4 + 0x30) = 0;
          *(undefined8 *)(lVar7 + 0x30) = 0;
          lVar5 = lVar4;
          if (lVar7 != 0) {
            if (*(ulong *)(lVar4 + 8) < *(ulong *)(lVar7 + 8)) {
              *(long *)(lVar7 + 0x28) = lVar4;
              lVar3 = *(long *)(lVar4 + 0x38);
              *(long *)(lVar7 + 0x30) = lVar3;
              if (lVar3 != 0) {
                *(long *)(lVar3 + 0x28) = lVar7;
              }
              *(long *)(lVar4 + 0x38) = lVar7;
            }
            else {
              *(long *)(lVar4 + 0x28) = lVar7;
              lVar5 = *(long *)(lVar7 + 0x38);
              *(long *)(lVar4 + 0x30) = lVar5;
              if (lVar5 != 0) {
                *(long *)(lVar5 + 0x28) = lVar4;
              }
              *(long *)(lVar7 + 0x38) = lVar4;
              lVar5 = lVar7;
            }
          }
          if (lVar2 == 0) break;
          *(long *)(lVar6 + 0x30) = lVar5;
          lVar7 = *(long *)(lVar2 + 0x30);
          lVar4 = lVar2;
          lVar6 = lVar5;
        }
      }
    }
    *(void **)(lVar5 + 0x28) = pvVar1;
    lVar6 = *(long *)((long)pvVar1 + 0x38);
    *(long *)(lVar5 + 0x30) = lVar6;
    if (lVar6 != 0) {
      *(long *)(lVar6 + 0x28) = lVar5;
    }
    *(long *)((long)pvVar1 + 0x38) = lVar5;
  }
  return (hpdata_t *)(ph->ph).root;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}